

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config_inl.hpp
# Opt level: O1

vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> * __thiscall
CLI::ConfigBase::from_config
          (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *__return_storage_ptr__,
          ConfigBase *this,istream *input)

{
  char cVar1;
  byte closure_char;
  short sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__first1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__last1;
  size_t sVar3;
  pointer pcVar4;
  pointer pCVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  istream *piVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var14;
  undefined8 uVar15;
  pointer pbVar16;
  pointer extraout_RAX;
  undefined8 in_R8;
  undefined7 uVar17;
  uint uVar18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it_4;
  size_t start;
  pointer str;
  pointer pCVar19;
  bool bVar20;
  bool bVar21;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parents;
  string item;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items_buffer;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  string line;
  string currentSection;
  string name;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it_1;
  string buffer;
  string previousSection;
  string line_sep_chars;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [12];
  uint local_2bc;
  undefined1 local_2b8 [17];
  undefined7 uStack_2a7;
  undefined8 uStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  uint local_264;
  undefined1 local_260 [36];
  uint local_23c;
  undefined1 local_238 [32];
  uint local_218;
  int local_214;
  string local_210;
  string local_1f0;
  undefined1 *local_1d0;
  pointer local_1c8;
  uint local_1c0;
  int local_1bc;
  pointer local_1b8;
  pointer local_1b0;
  undefined1 local_1a8 [24];
  string local_190;
  undefined1 *local_170;
  char *local_168;
  undefined1 local_160 [16];
  undefined1 local_150 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  undefined1 local_120 [32];
  char local_100 [16];
  char *local_f0;
  undefined8 local_e8;
  char local_e0;
  char local_df;
  char local_de;
  undefined1 local_dd;
  undefined1 local_d0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [3];
  
  local_238._0_8_ = local_238 + 0x10;
  local_238._8_8_ = 0;
  local_238[0x10] = '\0';
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  local_190._M_string_length = 0;
  local_190.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  local_298._8_8_ = __return_storage_ptr__;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"default","");
  local_170 = local_160;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"default","");
  *(long *)local_298._8_8_ = 0;
  *(pointer *)(local_298._8_8_ + 8) = (pointer)0x0;
  *(pointer *)(local_298._8_8_ + 0x10) = (pointer)0x0;
  cVar1 = this->arrayStart;
  local_1a8._20_4_ = SEXT14(cVar1);
  cVar6 = this->arrayEnd;
  if (cVar6 == ']' && cVar1 == '[') {
    bVar20 = this->arraySeparator == ',';
    uVar17 = (undefined7)((ulong)in_R8 >> 8);
  }
  else {
    bVar20 = false;
    uVar17 = 0;
  }
  local_1bc = (int)cVar6;
  bVar21 = (local_1a8._20_4_ & 0xdf) == 0;
  local_218 = (uint)(byte)this->arraySeparator;
  uVar18 = 0x2c;
  if (this->arraySeparator != 0x20) {
    uVar18 = local_218;
  }
  if (bVar21 && cVar1 == cVar6) {
    local_1a8._20_4_ = 0x5b;
    local_1bc = 0x5d;
    local_218 = uVar18;
  }
  local_e0 = this->parentSeparatorChar;
  local_df = this->commentChar;
  local_de = this->valueDelimiter;
  local_f0 = &local_e0;
  local_e8 = 3;
  local_dd = 0;
  local_1c0 = (uint)CONCAT71(uVar17,bVar20 | (bVar21 && cVar1 == cVar6));
  local_214 = 0;
  local_23c = 0;
  local_298._M_allocated_capacity = (size_type)this;
  do {
    cVar1 = (char)input;
    cVar6 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
    piVar10 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                        (input,(string *)(local_1a8 + 0x18),cVar6);
    if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) {
      iVar9 = ::std::__cxx11::string::compare((char *)&local_210);
      if (iVar9 != 0) {
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        local_1f0._M_string_length = 0;
        local_1f0.field_2._M_local_buf[0] = '\0';
        std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                  ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_298._8_8_);
        detail::generate_parents
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2e8,&local_210,&local_1f0,
                   *(char *)(local_298._M_allocated_capacity + 0x28));
        uVar15 = local_298._8_8_;
        pCVar19 = *(pointer *)(local_298._8_8_ + 8);
        local_2b8._0_8_ =
             pCVar19[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_2b8._8_8_ =
             pCVar19[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        unique0x10001586 =
             pCVar19[-1].parents.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pCVar19[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._0_8_;
        pCVar19[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._8_8_;
        pCVar19[-1].parents.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8._16_8_;
        local_2e8._0_8_ = (pointer)0x0;
        local_2e8._8_8_ = (pointer)0x0;
        local_2e8._16_8_ = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2e8);
        ::std::__cxx11::string::_M_replace
                  ((ulong)&(*(pointer *)(uVar15 + 8))[-1].name,0,
                   (char *)(*(pointer *)(uVar15 + 8))[-1].name._M_string_length,0x1304b2);
        pCVar19 = *(pointer *)(uVar15 + 8);
        uVar12 = (long)pCVar19[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)pCVar19[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        while (0x20 < uVar12) {
          std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::push_back
                    ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)uVar15,
                     pCVar19 + -1);
          pCVar19 = (((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)uVar15)->
                    super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          pbVar16 = pCVar19[-1].parents.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pCVar19[-1].parents.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar16 + -1;
          pcVar4 = pbVar16[-1]._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar4 != &pbVar16[-1].field_2) {
            operator_delete(pcVar4);
          }
          pCVar19 = *(pointer *)(local_298._8_8_ + 8);
          uVar15 = local_298._8_8_;
          uVar12 = (long)pCVar19[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pCVar19[-1].parents.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0);
      }
      if (local_170 != local_160) {
        operator_delete(local_170);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p);
      }
      if ((pointer)local_238._0_8_ != (pointer)(local_238 + 0x10)) {
        operator_delete((void *)local_238._0_8_);
      }
      return (vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_298._8_8_;
    }
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    local_1f0._M_string_length = 0;
    local_1f0.field_2._M_local_buf[0] = '\0';
    detail::trim_copy((string *)local_2b8,(string *)(local_1a8 + 0x18));
    ::std::__cxx11::string::operator=((string *)local_238,(string *)local_2b8);
    if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
      operator_delete((void *)local_2b8._0_8_);
    }
    if (2 < (ulong)local_238._8_8_) {
      iVar9 = ::std::__cxx11::string::compare((ulong)local_238,0,(char *)0x3);
      if ((iVar9 == 0) ||
         (iVar9 = ::std::__cxx11::string::compare((ulong)local_238,0,(char *)0x3), iVar9 == 0)) {
        cVar6 = *(char *)local_238._0_8_;
        bVar20 = true;
        do {
          cVar7 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
          piVar10 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                              (input,(string *)local_238,cVar7);
          if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
          local_2b8._0_8_ = local_238._0_8_ + local_238._8_8_;
          local_2e8._0_8_ = local_238._0_8_;
          ::std::
          __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    (local_260,(string *)local_2b8,local_2e8);
          local_238._8_8_ = local_260._0_8_ - local_238._0_8_;
          *(char *)local_260._0_8_ = '\0';
          _Var14 = ::std::
                   __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                             ();
          if ((char *)(local_238._0_8_ + local_238._8_8_) == _Var14._M_current) {
            local_238._8_8_ = 0;
            *(char *)local_238._0_8_ = '\0';
          }
          else {
            ::std::__cxx11::string::_M_erase((ulong)local_238,0);
          }
          if ((((2 < (ulong)local_238._8_8_) &&
               (((char *)(local_238._0_8_ + -1))[local_238._8_8_] == cVar6)) &&
              (((char *)(local_238._0_8_ + -2))[local_238._8_8_] == cVar6)) &&
             (((char *)(local_238._0_8_ + -3))[local_238._8_8_] == cVar6)) {
            bVar20 = false;
          }
        } while (bVar20);
      }
      else {
        cVar6 = *(char *)local_238._0_8_;
        if ((cVar6 != '#') && (cVar6 != ';')) {
          if ((cVar6 == '[') && (((char *)(local_238._0_8_ + -1))[local_238._8_8_] == ']')) {
            iVar9 = ::std::__cxx11::string::compare((char *)&local_210);
            if (iVar9 != 0) {
              std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                        ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                         local_298._8_8_);
              detail::generate_parents
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_2e8,&local_210,&local_1f0,
                         *(char *)(local_298._M_allocated_capacity + 0x28));
              uVar15 = local_298._8_8_;
              pCVar19 = *(pointer *)(local_298._8_8_ + 8);
              local_2b8._0_8_ =
                   pCVar19[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              local_2b8._8_8_ =
                   pCVar19[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              unique0x10001326 =
                   pCVar19[-1].parents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pCVar19[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._0_8_;
              pCVar19[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._8_8_;
              pCVar19[-1].parents.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8._16_8_;
              local_2e8._0_8_ = (pointer)0x0;
              local_2e8._8_8_ = (pointer)0x0;
              local_2e8._16_8_ = (pointer)0x0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2b8);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_2e8);
              ::std::__cxx11::string::_M_replace
                        ((ulong)&(*(pointer *)(uVar15 + 8))[-1].name,0,
                         (char *)(*(pointer *)(uVar15 + 8))[-1].name._M_string_length,0x1304b2);
            }
            ::std::__cxx11::string::substr((ulong)local_2b8,(ulong)local_238);
            ::std::__cxx11::string::operator=((string *)&local_210,(string *)local_2b8);
            if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
              operator_delete((void *)local_2b8._0_8_);
            }
            if ((((char *)0x1 < local_210._M_string_length) && (*local_210._M_dataplus._M_p == '['))
               && ((local_210._M_dataplus._M_p + -1)[local_210._M_string_length] == ']')) {
              ::std::__cxx11::string::substr((ulong)local_2b8,(ulong)&local_210);
              ::std::__cxx11::string::operator=((string *)&local_210,(string *)local_2b8);
              if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_);
              }
            }
            local_1b8 = (pointer)local_1a8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,local_210._M_dataplus._M_p,
                       (char *)(local_210._M_string_length + (long)local_210._M_dataplus._M_p));
            ::std::
            transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
                      (local_1b8,
                       (char *)((long)&(local_1b0->_M_dataplus)._M_p + (long)&local_1b8->_M_dataplus
                               ),local_1b8);
            if (local_1b8 == (pointer)local_1a8) {
              uStack_2a0 = local_1a8._8_8_;
              local_2b8._0_8_ = (pointer)(local_2b8 + 0x10);
            }
            else {
              local_2b8._0_8_ = local_1b8;
            }
            uStack_2a7 = local_1a8._1_7_;
            local_2b8[0x10] = local_1a8[0];
            local_2b8._8_8_ = local_1b0;
            local_1b0 = (pointer)0x0;
            local_1a8[0] = 0;
            local_1b8 = (pointer)local_1a8;
            iVar9 = ::std::__cxx11::string::compare((char *)local_2b8);
            if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
              operator_delete((void *)local_2b8._0_8_);
            }
            if (local_1b8 != (pointer)local_1a8) {
              operator_delete(local_1b8);
            }
            if (iVar9 == 0) {
              ::std::__cxx11::string::_M_replace
                        ((ulong)&local_210,0,(char *)local_210._M_string_length,0x130ed8);
            }
            else {
              detail::checkParentSegments
                        ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                         local_298._8_8_,&local_210,
                         *(char *)(local_298._M_allocated_capacity + 0x28));
            }
            if (((char *)local_210._M_string_length == local_168) &&
               (((char *)local_210._M_string_length == (char *)0x0 ||
                (iVar9 = bcmp(local_210._M_dataplus._M_p,local_170,local_210._M_string_length),
                iVar9 == 0)))) {
              local_214 = local_214 + 1;
              local_23c = 0;
            }
            else {
              local_214 = 0;
              ::std::__cxx11::string::_M_assign((string *)&local_170);
              local_23c = 0;
            }
          }
          else if (cVar6 != *(char *)(local_298._M_allocated_capacity + 0x20)) {
            lVar11 = ::std::__cxx11::string::find_first_of((char *)local_238,0x130ee4,0);
            if (lVar11 != -1) {
              start = 0;
              do {
                if ((ulong)local_238._8_8_ <= start) break;
                closure_char = *(byte *)(local_238._0_8_ + start);
                if ((closure_char - 0x22 < 0x3f) &&
                   ((0x4000000000000021U >> ((ulong)(closure_char - 0x22) & 0x3f) & 1) != 0)) {
                  start = detail::close_sequence((string *)local_238,start,closure_char);
LAB_0010b38a:
                  start = start + 1;
LAB_0010b38d:
                  bVar20 = true;
                }
                else {
                  if ((closure_char != *(char *)(local_298._M_allocated_capacity + 0x24)) &&
                     (closure_char != *(char *)(local_298._M_allocated_capacity + 0x20))) {
                    if (((closure_char == 9) || (closure_char == 0x20)) ||
                       (closure_char == *(char *)(local_298._M_allocated_capacity + 0x28)))
                    goto LAB_0010b38a;
                    start = ::std::__cxx11::string::find_first_of
                                      ((char *)local_238,(ulong)local_f0,start);
                    goto LAB_0010b38d;
                  }
                  start = start - 1;
                  bVar20 = false;
                }
              } while (bVar20);
            }
            uVar15 = local_298._M_allocated_capacity;
            cVar6 = (char)(string *)local_238;
            uVar12 = ::std::__cxx11::string::find
                               (cVar6,(ulong)(uint)(int)*(char *)(local_298._M_allocated_capacity +
                                                                 0x24));
            uVar13 = ::std::__cxx11::string::find(cVar6,(ulong)(uint)(int)*(char *)(uVar15 + 0x20));
            if (uVar12 == 0xffffffffffffffff || uVar13 < uVar12) {
              ::std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_238);
              detail::trim_copy((string *)local_2b8,(string *)local_2e8);
              ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_2b8);
              if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_);
              }
              if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_);
              }
              local_2b8._0_8_ = local_2b8 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"true","");
              ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_assign_aux<std::__cxx11::string_const*>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_288,(string *)local_2b8,&local_298);
            }
            else {
              ::std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_238);
              detail::trim_copy((string *)local_2b8,(string *)local_2e8);
              ::std::__cxx11::string::operator=((string *)&local_1f0,(string *)local_2b8);
              if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
                operator_delete((void *)local_2b8._0_8_);
              }
              if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_);
              }
              ::std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_238);
              detail::trim_copy((string *)local_2b8,(string *)local_2e8);
              if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                operator_delete((void *)local_2e8._0_8_);
              }
              iVar9 = ::std::__cxx11::string::compare((ulong)local_2b8,0,(char *)0x3);
              if (iVar9 == 0) {
                bVar20 = true;
              }
              else {
                iVar9 = ::std::__cxx11::string::compare((ulong)local_2b8,0,(char *)0x3);
                bVar20 = iVar9 == 0;
              }
              if (!(bool)(uVar13 == 0xffffffffffffffff | bVar20)) {
                local_120._16_8_ = local_100;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_120 + 0x10),local_2b8._0_8_,
                           (char *)(local_2b8._0_8_ + (long)(_Alloc_hider *)local_2b8._8_8_));
                detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_260,(string *)(local_120 + 0x10),
                                 *(char *)(local_298._M_allocated_capacity + 0x20));
                if ((char *)local_120._16_8_ != local_100) {
                  operator_delete((void *)local_120._16_8_);
                }
                detail::trim_copy((string *)local_2e8,(string *)local_260._0_8_);
                ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2e8);
                if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                  operator_delete((void *)local_2e8._0_8_);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_260);
              }
              cVar6 = (char)(string *)local_2b8;
              if (bVar20) {
                cVar7 = *(char *)local_2b8._0_8_;
                ::std::__cxx11::string::substr((ulong)local_2e8,(ulong)(local_1a8 + 0x18));
                ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2e8);
                if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                  operator_delete((void *)local_2e8._0_8_);
                }
                _Var14 = ::std::
                         __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                   ();
                if ((char *)(local_2b8._0_8_ + (long)(_Alloc_hider *)local_2b8._8_8_) ==
                    _Var14._M_current) {
                  local_2b8._8_8_ = (pointer)0x0;
                  *(char *)local_2b8._0_8_ = '\0';
                }
                else {
                  ::std::__cxx11::string::_M_erase((ulong)local_2b8,0);
                }
                ::std::__cxx11::string::erase((ulong)local_2b8,0);
                if (((pointer)local_2b8._8_8_ == (pointer)0x0) ||
                   (((char *)(local_2b8._0_8_ + -1))[local_2b8._8_8_] != '\\')) {
                  bVar20 = true;
                  if (((ulong)local_2b8._8_8_ < (pointer)0x3) ||
                     (((((char *)(local_2b8._0_8_ + -1))[local_2b8._8_8_] != cVar7 ||
                       (((char *)(local_2b8._0_8_ + -2))[local_2b8._8_8_] != cVar7)) ||
                      (((char *)(local_2b8._0_8_ + -3))[local_2b8._8_8_] != cVar7)))) {
                    local_2bc = 0;
                    pbVar16 = (pointer)local_2b8._8_8_;
                  }
                  else {
                    ::std::__cxx11::string::pop_back();
                    ::std::__cxx11::string::pop_back();
                    pbVar16 = (pointer)::std::__cxx11::string::pop_back();
                    if (cVar7 == '\"') {
                      detail::remove_escaped_characters((string *)local_2e8,(string *)local_2b8);
                      ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_2e8);
                      pbVar16 = (pointer)(local_2e8 + 0x10);
                      if ((pointer)local_2e8._0_8_ != pbVar16) {
                        operator_delete((void *)local_2e8._0_8_);
                        pbVar16 = extraout_RAX;
                      }
                    }
                    local_2bc = 0;
                    bVar20 = false;
                  }
                }
                else {
                  uVar15 = ::std::__cxx11::string::pop_back();
                  pbVar16 = (pointer)CONCAT71((int7)((ulong)uVar15 >> 8),1);
                  local_2bc = (uint)pbVar16;
                  bVar20 = true;
                }
                local_264 = (uint)CONCAT71((int7)((ulong)pbVar16 >> 8),1);
                do {
                  if (!bVar20) break;
                  local_2e8._0_8_ = local_2e8 + 0x10;
                  local_2e8._8_8_ = (pointer)0x0;
                  local_2e8._16_8_ = local_2e8._16_8_ & 0xffffffffffffff00;
                  cVar8 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar10 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (input,(string *)local_2e8,cVar8);
                  uVar18 = *(uint *)(piVar10 + *(long *)(*(long *)piVar10 + -0x18) + 0x20);
                  if ((uVar18 & 5) == 0) {
                    ::std::__cxx11::string::_M_assign((string *)local_238);
                    local_260._0_8_ = local_238._0_8_ + local_238._8_8_;
                    local_1c8 = (pointer)local_238._0_8_;
                    ::std::
                    __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                              (&local_1d0,local_260,&local_1c8);
                    local_238._8_8_ = (long)local_1d0 - local_238._0_8_;
                    *local_1d0 = 0;
                    if ((((ulong)local_238._8_8_ < 3) ||
                        (((char *)(local_238._0_8_ + -1))[local_238._8_8_] != cVar7)) ||
                       ((((char *)(local_238._0_8_ + -2))[local_238._8_8_] != cVar7 ||
                        (((char *)(local_238._0_8_ + -3))[local_238._8_8_] != cVar7)))) {
                      if ((local_2bc & 1) == 0) {
                        if (((local_264 & 1) == 0) || ((pointer)local_2b8._8_8_ != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back(cVar6);
                        }
                      }
                      else {
                        local_260._0_8_ = local_2e8._0_8_ + (long)(_Alloc_hider *)local_2e8._8_8_;
                        local_1c8 = (pointer)local_2e8._0_8_;
                        ::std::
                        __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                  (&local_1d0,local_260,&local_1c8);
                        local_2e8._8_8_ = local_1d0 + -local_2e8._0_8_;
                        *local_1d0 = 0;
                        _Var14 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           ();
                        if ((char *)(local_2e8._0_8_ + (long)(_Alloc_hider *)local_2e8._8_8_) ==
                            _Var14._M_current) {
                          local_2e8._8_8_ = (pointer)0x0;
                          *(char *)local_2e8._0_8_ = '\0';
                        }
                        else {
                          ::std::__cxx11::string::_M_erase((ulong)local_2e8,0);
                        }
                      }
                      if (((pointer)local_2e8._8_8_ == (pointer)0x0) ||
                         (((char *)(local_2e8._0_8_ + -1))[local_2e8._8_8_] != '\\')) {
                        local_2bc = 0;
                      }
                      else {
                        uVar15 = ::std::__cxx11::string::pop_back();
                        local_2bc = (uint)CONCAT71((int7)((ulong)uVar15 >> 8),1);
                      }
                      ::std::__cxx11::string::_M_append((char *)local_2b8,local_2e8._0_8_);
                      local_264 = 0;
                    }
                    else {
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      ::std::__cxx11::string::pop_back();
                      if ((local_2bc & 1) == 0) {
                        if (((local_264 & 1) == 0) || ((pointer)local_2b8._8_8_ != (pointer)0x0)) {
                          ::std::__cxx11::string::push_back(cVar6);
                        }
                      }
                      else {
                        _Var14 = ::std::
                                 __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                           ();
                        if ((char *)(local_238._0_8_ + local_238._8_8_) == _Var14._M_current) {
                          local_238._8_8_ = 0;
                          *(char *)local_238._0_8_ = '\0';
                        }
                        else {
                          ::std::__cxx11::string::_M_erase((ulong)local_238,0);
                        }
                      }
                      ::std::__cxx11::string::_M_append((char *)local_2b8,local_238._0_8_);
                      if (((pointer)local_2b8._8_8_ != (pointer)0x0) &&
                         (((char *)(local_2b8._0_8_ + -1))[local_2b8._8_8_] == '\n')) {
                        ::std::__cxx11::string::pop_back();
                      }
                      if (cVar7 == '\"') {
                        detail::remove_escaped_characters((string *)local_260,(string *)local_2b8);
                        ::std::__cxx11::string::operator=((string *)local_2b8,(string *)local_260);
                        if ((pointer)local_260._0_8_ != (pointer)(local_260 + 0x10)) {
                          operator_delete((void *)local_260._0_8_);
                        }
                      }
                      local_264 = 0;
                      bVar20 = false;
                    }
                  }
                  if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                    operator_delete((void *)local_2e8._0_8_);
                  }
                } while ((uVar18 & 5) == 0);
                local_2e8._0_8_ = local_2e8 + 0x10;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)local_2e8,local_2b8._0_8_,
                           (char *)(local_2b8._0_8_ + (long)(_Alloc_hider *)local_2b8._8_8_));
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_assign_aux<std::__cxx11::string_const*>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_288,local_2e8,local_2c8);
LAB_0010c005:
                pbVar16 = (pointer)(local_2e8 + 0x10);
                uVar15 = local_2e8._0_8_;
              }
              else if (((ulong)local_2b8._8_8_ < (pointer)0x2) ||
                      (local_1a8._20_4_ != (int)*(char *)local_2b8._0_8_)) {
                if ((local_1c0 & 1) == 0) {
LAB_0010bfd2:
                  local_2e8._0_8_ = local_2e8 + 0x10;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_2e8,local_2b8._0_8_,
                             (char *)(local_2b8._0_8_ + (long)(_Alloc_hider *)local_2b8._8_8_));
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_assign_aux<std::__cxx11::string_const*>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_288,local_2e8,local_2c8);
                  goto LAB_0010c005;
                }
                cVar1 = (char)local_218;
                lVar11 = ::std::__cxx11::string::find(cVar6,(ulong)(uint)(int)(char)local_218);
                if (lVar11 == -1) {
                  if (((local_1c0 & 1) == 0) ||
                     (lVar11 = ::std::__cxx11::string::find(cVar6,0x20), lVar11 == -1))
                  goto LAB_0010bfd2;
                  local_150._0_8_ = local_150 + 0x10;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)local_150,local_2b8._0_8_,
                             (char *)(local_2b8._0_8_ + (long)(_Alloc_hider *)local_2b8._8_8_));
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_260,(string *)local_150,'\0');
                  local_2e8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2e8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2e8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_260._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_260._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_260._16_8_;
                  local_260._0_8_ = (pointer)0x0;
                  local_260._8_8_ = (pointer)0x0;
                  local_260._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2e8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260);
                  pbVar16 = (pointer)(local_150 + 0x10);
                  uVar15 = local_150._0_8_;
                }
                else {
                  local_130._M_allocated_capacity = (size_type)local_120;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_130,local_2b8._0_8_,
                             (char *)(local_2b8._0_8_ + (long)(_Alloc_hider *)local_2b8._8_8_));
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_260,(string *)&local_130,cVar1);
                  local_2e8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2e8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2e8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_260._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_260._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_260._16_8_;
                  local_260._0_8_ = (pointer)0x0;
                  local_260._8_8_ = (pointer)0x0;
                  local_260._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2e8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260);
                  pbVar16 = (pointer)local_120;
                  uVar15 = local_130._M_allocated_capacity;
                }
              }
              else {
                local_2e8._0_8_ = local_2e8 + 0x10;
                local_2e8._8_8_ = (pointer)0x0;
                local_2e8._16_8_ = local_2e8._16_8_ & 0xffffffffffffff00;
                while (local_1bc != ((char *)(local_2b8._0_8_ + -1))[local_2b8._8_8_]) {
                  cVar6 = ::std::ios::widen((char)*(undefined8 *)(*(long *)input + -0x18) + cVar1);
                  piVar10 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      (input,(string *)local_2e8,cVar6);
                  if (((byte)piVar10[*(long *)(*(long *)piVar10 + -0x18) + 0x20] & 5) != 0) break;
                  local_260._0_8_ = local_2e8._0_8_ + (long)(_Alloc_hider *)local_2e8._8_8_;
                  local_1c8 = (pointer)local_2e8._0_8_;
                  ::std::
                  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
                            (&local_1d0,local_260,&local_1c8);
                  local_2e8._8_8_ = local_1d0 + -local_2e8._0_8_;
                  *local_1d0 = 0;
                  _Var14 = ::std::
                           __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                                     ();
                  if ((char *)(local_2e8._0_8_ + (long)(_Alloc_hider *)local_2e8._8_8_) ==
                      _Var14._M_current) {
                    local_2e8._8_8_ = (pointer)0x0;
                    *(char *)local_2e8._0_8_ = '\0';
                  }
                  else {
                    ::std::__cxx11::string::_M_erase((ulong)local_2e8,0);
                  }
                  ::std::__cxx11::string::_M_append((char *)local_2b8,local_2e8._0_8_);
                }
                if ((pointer)local_2e8._0_8_ != (pointer)(local_2e8 + 0x10)) {
                  operator_delete((void *)local_2e8._0_8_);
                }
                if (local_1bc == ((char *)(local_2b8._0_8_ + -1))[local_2b8._8_8_]) {
                  ::std::__cxx11::string::substr((ulong)&local_b0,(ulong)local_2b8);
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_260,(string *)&local_b0,(char)local_218);
                  local_2e8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2e8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2e8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_260._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_260._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_260._16_8_;
                  local_260._0_8_ = (pointer)0x0;
                  local_260._8_8_ = (pointer)0x0;
                  local_260._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2e8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260);
                  pbVar16 = local_a0;
                  uVar15 = local_b0._M_allocated_capacity;
                }
                else {
                  ::std::__cxx11::string::substr((ulong)local_d0,(ulong)local_2b8);
                  detail::split_up((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)local_260,(string *)local_d0,(char)local_218);
                  local_2e8._16_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_2e8._8_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  local_2e8._0_8_ =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_260._0_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_260._8_8_;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_260._16_8_;
                  local_260._0_8_ = (pointer)0x0;
                  local_260._8_8_ = (pointer)0x0;
                  local_260._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2e8);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_260);
                  pbVar16 = (pointer)(local_d0 + 0x10);
                  uVar15 = local_d0._0_8_;
                }
              }
              if ((pointer)uVar15 != pbVar16) {
                operator_delete((void *)uVar15);
              }
            }
            if ((pointer)local_2b8._0_8_ != (pointer)(local_2b8 + 0x10)) {
              operator_delete((void *)local_2b8._0_8_);
            }
            local_2e8._0_8_ = (pointer)0x0;
            local_2e8._8_8_ = (pointer)0x0;
            local_2e8._16_8_ = (pointer)0x0;
            detail::generate_parents
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_260,&local_210,&local_1f0,
                       *(char *)(local_298._M_allocated_capacity + 0x28));
            unique0x10002fb9 = local_2e8._16_8_;
            local_2b8._8_8_ = local_2e8._8_8_;
            local_2b8._0_8_ = local_2e8._0_8_;
            local_2e8._0_8_ = local_260._0_8_;
            local_2e8._8_8_ = local_260._8_8_;
            local_2e8._16_8_ = local_260._16_8_;
            local_260._0_8_ = (pointer)0x0;
            local_260._8_8_ = (pointer)0x0;
            local_260._16_8_ = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2b8);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_260);
            detail::process_quoted_string(&local_1f0,'\"','\'');
            pbVar16 = local_288.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            for (str = local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; uVar15 = local_2e8._0_8_,
                str != pbVar16; str = str + 1) {
              detail::process_quoted_string
                        (str,*(char *)(local_298._M_allocated_capacity + 0x25),
                         *(char *)(local_298._M_allocated_capacity + 0x26));
            }
            if ((ulong)((long)(local_2e8._8_8_ - local_2e8._0_8_) >> 5) <=
                (ulong)*(uint8_t *)(local_298._M_allocated_capacity + 0x27)) {
              if ((*(size_type *)(local_298._M_allocated_capacity + 0x38) == 0) ||
                 ((local_23c & 1) != 0)) {
LAB_0010c13d:
                pCVar19 = *(pointer *)(local_298._8_8_ + 8);
                if (*(pointer *)local_298._8_8_ != pCVar19) {
                  bVar20 = *(bool *)(local_298._M_allocated_capacity + 0x2a);
                  pCVar5 = pCVar19;
                  do {
                    pCVar19 = pCVar5 + -1;
                    __first1 = (pCVar19->parents).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                    __last1 = pCVar5[-1].parents.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    if (((((long)__last1 - (long)__first1 == local_2e8._8_8_ - local_2e8._0_8_) &&
                         (bVar21 = ::std::__equal<false>::
                                   equal<std::__cxx11::string_const*,std::__cxx11::string_const*>
                                             (__first1,__last1,
                                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_2e8._0_8_), bVar21)) &&
                        (sVar3 = pCVar5[-1].name._M_string_length,
                        sVar3 == local_1f0._M_string_length)) &&
                       ((sVar3 == 0 ||
                        (iVar9 = bcmp(pCVar5[-1].name._M_dataplus._M_p,local_1f0._M_dataplus._M_p,
                                      sVar3), iVar9 == 0)))) goto LAB_0010c1c4;
                  } while ((pCVar19 != *(pointer *)local_298._8_8_) &&
                          (pCVar5 = pCVar19, bVar20 != false));
                  pCVar19 = *(pointer *)(local_298._8_8_ + 8);
                }
LAB_0010c1c4:
                uVar15 = local_298._8_8_;
                if (pCVar19 == *(pointer *)(local_298._8_8_ + 8)) {
                  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::emplace_back<>
                            ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)
                             local_298._8_8_);
                  pCVar19 = *(pointer *)(uVar15 + 8);
                  local_2b8._0_8_ =
                       pCVar19[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_2b8._8_8_ =
                       pCVar19[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  unique0x100014e6 =
                       pCVar19[-1].parents.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pCVar19[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2e8._0_8_;
                  pCVar19[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2e8._8_8_;
                  pCVar19[-1].parents.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8._16_8_;
                  local_2e8._0_8_ = (pointer)0x0;
                  local_2e8._8_8_ = (pointer)0x0;
                  local_2e8._16_8_ = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2b8);
                  ::std::__cxx11::string::operator=
                            ((string *)&(*(pointer *)(uVar15 + 8))[-1].name,(string *)&local_1f0);
                  pCVar19 = *(pointer *)(uVar15 + 8);
                  local_2b8._0_8_ =
                       pCVar19[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  local_2b8._8_8_ =
                       pCVar19[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  unique0x10001506 =
                       pCVar19[-1].inputs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  pCVar19[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
                  pCVar19[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
                  pCVar19[-1].inputs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       local_288.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  local_288.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_2b8);
                }
                else {
                  pbVar16 = (pCVar19->inputs).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((((0x20 < (ulong)((long)pbVar16 -
                                       (long)(pCVar19->inputs).
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)) &&
                       (0x20 < (ulong)((long)local_288.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_288.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start))) ||
                      (*(bool *)(local_298._M_allocated_capacity + 0x2a) == true)) &&
                     ((((pbVar16[-1]._M_string_length != 0 &&
                        ((local_288.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_string_length != 0)) &&
                       (iVar9 = ::std::__cxx11::string::compare((char *)(pbVar16 + -1)), iVar9 != 0)
                       ) && (iVar9 = ::std::__cxx11::string::compare
                                               ((char *)local_288.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start),
                            iVar9 != 0)))) {
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[3]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &pCVar19->inputs,(char (*) [3])"%%");
                    pCVar19->multiline = true;
                  }
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &pCVar19->inputs,
                             (pCVar19->inputs).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_288.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             local_288.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
                }
              }
              else if (((local_2e8._0_8_ != local_2e8._8_8_) &&
                       (sVar3 = *(size_type *)(local_2e8._0_8_ + 8),
                       sVar3 == *(size_type *)(local_298._M_allocated_capacity + 0x38))) &&
                      ((sVar3 == 0 ||
                       (iVar9 = bcmp(((_Alloc_hider *)local_2e8._0_8_)->_M_p,
                                     (((string *)(local_298._M_allocated_capacity + 0x30))->
                                     _M_dataplus)._M_p,sVar3), iVar9 == 0)))) {
                sVar2 = *(int16_t *)(local_298._M_allocated_capacity + 0x2c);
                if (local_214 == sVar2 || sVar2 < 0) {
                  local_23c = (uint)CONCAT71((uint7)(uint3)(int3)(char)((ushort)sVar2 >> 8),1);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2e8,(iterator)uVar15);
                  goto LAB_0010c13d;
                }
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2e8);
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
  } while( true );
}

Assistant:

inline std::vector<ConfigItem> ConfigBase::from_config(std::istream &input) const {
    std::string line;
    std::string buffer;
    std::string currentSection = "default";
    std::string previousSection = "default";
    std::vector<ConfigItem> output;
    bool isDefaultArray = (arrayStart == '[' && arrayEnd == ']' && arraySeparator == ',');
    bool isINIArray = (arrayStart == '\0' || arrayStart == ' ') && arrayStart == arrayEnd;
    bool inSection{false};
    bool inMLineComment{false};
    bool inMLineValue{false};

    char aStart = (isINIArray) ? '[' : arrayStart;
    char aEnd = (isINIArray) ? ']' : arrayEnd;
    char aSep = (isINIArray && arraySeparator == ' ') ? ',' : arraySeparator;
    int currentSectionIndex{0};

    std::string line_sep_chars{parentSeparatorChar, commentChar, valueDelimiter};
    while(getline(input, buffer)) {
        std::vector<std::string> items_buffer;
        std::string name;
        line = detail::trim_copy(buffer);
        std::size_t len = line.length();
        // lines have to be at least 3 characters to have any meaning to CLI just skip the rest
        if(len < 3) {
            continue;
        }
        if(line.compare(0, 3, multiline_string_quote) == 0 || line.compare(0, 3, multiline_literal_quote) == 0) {
            inMLineComment = true;
            auto cchar = line.front();
            while(inMLineComment) {
                if(getline(input, line)) {
                    detail::trim(line);
                } else {
                    break;
                }
                if(detail::hasMLString(line, cchar)) {
                    inMLineComment = false;
                }
            }
            continue;
        }
        if(line.front() == '[' && line.back() == ']') {
            if(currentSection != "default") {
                // insert a section end which is just an empty items_buffer
                output.emplace_back();
                output.back().parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
                output.back().name = "--";
            }
            currentSection = line.substr(1, len - 2);
            // deal with double brackets for TOML
            if(currentSection.size() > 1 && currentSection.front() == '[' && currentSection.back() == ']') {
                currentSection = currentSection.substr(1, currentSection.size() - 2);
            }
            if(detail::to_lower(currentSection) == "default") {
                currentSection = "default";
            } else {
                detail::checkParentSegments(output, currentSection, parentSeparatorChar);
            }
            inSection = false;
            if(currentSection == previousSection) {
                ++currentSectionIndex;
            } else {
                currentSectionIndex = 0;
                previousSection = currentSection;
            }
            continue;
        }

        // comment lines
        if(line.front() == ';' || line.front() == '#' || line.front() == commentChar) {
            continue;
        }
        std::size_t search_start = 0;
        if(line.find_first_of("\"'`") != std::string::npos) {
            while(search_start < line.size()) {
                auto test_char = line[search_start];
                if(test_char == '\"' || test_char == '\'' || test_char == '`') {
                    search_start = detail::close_sequence(line, search_start, line[search_start]);
                    ++search_start;
                } else if(test_char == valueDelimiter || test_char == commentChar) {
                    --search_start;
                    break;
                } else if(test_char == ' ' || test_char == '\t' || test_char == parentSeparatorChar) {
                    ++search_start;
                } else {
                    search_start = line.find_first_of(line_sep_chars, search_start);
                }
            }
        }
        // Find = in string, split and recombine
        auto delimiter_pos = line.find_first_of(valueDelimiter, search_start + 1);
        auto comment_pos = line.find_first_of(commentChar, search_start);
        if(comment_pos < delimiter_pos) {
            delimiter_pos = std::string::npos;
        }
        if(delimiter_pos != std::string::npos) {

            name = detail::trim_copy(line.substr(0, delimiter_pos));
            std::string item = detail::trim_copy(line.substr(delimiter_pos + 1, std::string::npos));
            bool mlquote =
                (item.compare(0, 3, multiline_literal_quote) == 0 || item.compare(0, 3, multiline_string_quote) == 0);
            if(!mlquote && comment_pos != std::string::npos) {
                auto citems = detail::split_up(item, commentChar);
                item = detail::trim_copy(citems.front());
            }
            if(mlquote) {
                // multiline string
                auto keyChar = item.front();
                item = buffer.substr(delimiter_pos + 1, std::string::npos);
                detail::ltrim(item);
                item.erase(0, 3);
                inMLineValue = true;
                bool lineExtension{false};
                bool firstLine = true;
                if(!item.empty() && item.back() == '\\') {
                    item.pop_back();
                    lineExtension = true;
                } else if(detail::hasMLString(item, keyChar)) {
                    // deal with the first line closing the multiline literal
                    item.pop_back();
                    item.pop_back();
                    item.pop_back();
                    if(keyChar == '\"') {
                        try {
                            item = detail::remove_escaped_characters(item);
                        } catch(const std::invalid_argument &iarg) {
                            throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                        }
                    }
                    inMLineValue = false;
                }
                while(inMLineValue) {
                    std::string l2;
                    if(!std::getline(input, l2)) {
                        break;
                    }
                    line = l2;
                    detail::rtrim(line);
                    if(detail::hasMLString(line, keyChar)) {
                        line.pop_back();
                        line.pop_back();
                        line.pop_back();
                        if(lineExtension) {
                            detail::ltrim(line);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        firstLine = false;
                        item += line;
                        inMLineValue = false;
                        if(!item.empty() && item.back() == '\n') {
                            item.pop_back();
                        }
                        if(keyChar == '\"') {
                            try {
                                item = detail::remove_escaped_characters(item);
                            } catch(const std::invalid_argument &iarg) {
                                throw CLI::ParseError(iarg.what(), CLI::ExitCodes::InvalidError);
                            }
                        }
                    } else {
                        if(lineExtension) {
                            detail::trim(l2);
                        } else if(!(firstLine && item.empty())) {
                            item.push_back('\n');
                        }
                        lineExtension = false;
                        firstLine = false;
                        if(!l2.empty() && l2.back() == '\\') {
                            lineExtension = true;
                            l2.pop_back();
                        }
                        item += l2;
                    }
                }
                items_buffer = {item};
            } else if(item.size() > 1 && item.front() == aStart) {
                for(std::string multiline; item.back() != aEnd && std::getline(input, multiline);) {
                    detail::trim(multiline);
                    item += multiline;
                }
                if(item.back() == aEnd) {
                    items_buffer = detail::split_up(item.substr(1, item.length() - 2), aSep);
                } else {
                    items_buffer = detail::split_up(item.substr(1, std::string::npos), aSep);
                }
            } else if((isDefaultArray || isINIArray) && item.find_first_of(aSep) != std::string::npos) {
                items_buffer = detail::split_up(item, aSep);
            } else if((isDefaultArray || isINIArray) && item.find_first_of(' ') != std::string::npos) {
                items_buffer = detail::split_up(item, '\0');
            } else {
                items_buffer = {item};
            }
        } else {
            name = detail::trim_copy(line.substr(0, comment_pos));
            items_buffer = {"true"};
        }
        std::vector<std::string> parents;
        try {
            parents = detail::generate_parents(currentSection, name, parentSeparatorChar);
            detail::process_quoted_string(name);
            // clean up quotes on the items and check for escaped strings
            for(auto &it : items_buffer) {
                detail::process_quoted_string(it, stringQuote, literalQuote);
            }
        } catch(const std::invalid_argument &ia) {
            throw CLI::ParseError(ia.what(), CLI::ExitCodes::InvalidError);
        }

        if(parents.size() > maximumLayers) {
            continue;
        }
        if(!configSection.empty() && !inSection) {
            if(parents.empty() || parents.front() != configSection) {
                continue;
            }
            if(configIndex >= 0 && currentSectionIndex != configIndex) {
                continue;
            }
            parents.erase(parents.begin());
            inSection = true;
        }
        auto match = detail::find_matching_config(output, parents, name, allowMultipleDuplicateFields);
        if(match != output.end()) {
            if((match->inputs.size() > 1 && items_buffer.size() > 1) || allowMultipleDuplicateFields) {
                // insert a separator if one is not already present
                if(!(match->inputs.back().empty() || items_buffer.front().empty() || match->inputs.back() == "%%" ||
                     items_buffer.front() == "%%")) {
                    match->inputs.emplace_back("%%");
                    match->multiline = true;
                }
            }
            match->inputs.insert(match->inputs.end(), items_buffer.begin(), items_buffer.end());
        } else {
            output.emplace_back();
            output.back().parents = std::move(parents);
            output.back().name = std::move(name);
            output.back().inputs = std::move(items_buffer);
        }
    }
    if(currentSection != "default") {
        // insert a section end which is just an empty items_buffer
        std::string ename;
        output.emplace_back();
        output.back().parents = detail::generate_parents(currentSection, ename, parentSeparatorChar);
        output.back().name = "--";
        while(output.back().parents.size() > 1) {
            output.push_back(output.back());
            output.back().parents.pop_back();
        }
    }
    return output;
}